

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.c
# Opt level: O0

ma_result ma_resampler_get_heap_size(ma_resampler_config *pConfig,size_t *pHeapSizeInBytes)

{
  void *local_38;
  void *pVTableUserData;
  ma_resampling_backend_vtable *pVTable;
  size_t *psStack_20;
  ma_result result;
  size_t *pHeapSizeInBytes_local;
  ma_resampler_config *pConfig_local;
  
  if (pHeapSizeInBytes == (size_t *)0x0) {
    pConfig_local._4_4_ = MA_INVALID_ARGS;
  }
  else {
    *pHeapSizeInBytes = 0;
    if (pConfig == (ma_resampler_config *)0x0) {
      pConfig_local._4_4_ = MA_INVALID_ARGS;
    }
    else {
      psStack_20 = pHeapSizeInBytes;
      pHeapSizeInBytes_local = (size_t *)pConfig;
      pVTable._4_4_ =
           ma_resampler_get_vtable
                     (pConfig,(ma_resampler *)0x0,(ma_resampling_backend_vtable **)&pVTableUserData,
                      &local_38);
      pConfig_local._4_4_ = pVTable._4_4_;
      if (pVTable._4_4_ == MA_SUCCESS) {
        if ((pVTableUserData == (void *)0x0) || (*pVTableUserData == 0)) {
          pConfig_local._4_4_ = MA_NOT_IMPLEMENTED;
        }
        else {
          pConfig_local._4_4_ = (**pVTableUserData)(local_38,pHeapSizeInBytes_local,psStack_20);
          if (pConfig_local._4_4_ == MA_SUCCESS) {
            pConfig_local._4_4_ = MA_SUCCESS;
          }
        }
      }
    }
  }
  return pConfig_local._4_4_;
}

Assistant:

MA_API ma_result ma_resampler_get_heap_size(const ma_resampler_config* pConfig, size_t* pHeapSizeInBytes)
{
    ma_result result;
    ma_resampling_backend_vtable* pVTable;
    void* pVTableUserData;

    if (pHeapSizeInBytes == NULL) {
        return MA_INVALID_ARGS;
    }

    *pHeapSizeInBytes = 0;

    if (pConfig == NULL) {
        return MA_INVALID_ARGS;
    }

    result = ma_resampler_get_vtable(pConfig, NULL, &pVTable, &pVTableUserData);
    if (result != MA_SUCCESS) {
        return result;
    }

    if (pVTable == NULL || pVTable->onGetHeapSize == NULL) {
        return MA_NOT_IMPLEMENTED;
    }

    result = pVTable->onGetHeapSize(pVTableUserData, pConfig, pHeapSizeInBytes);
    if (result != MA_SUCCESS) {
        return result;
    }

    return MA_SUCCESS;
}